

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::EnforceProto3OptionalSupport
          (CommandLineInterface *this,string *codegen_name,uint64_t supported_features,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  int iVar1;
  pointer ppFVar2;
  FileDescriptor *this_00;
  bool bVar3;
  Edition EVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  pointer ppFVar8;
  
  if ((supported_features & 1) == 0) {
    ppFVar2 = (parsed_files->
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar8 = (parsed_files->
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppFVar8 != ppFVar2;
        ppFVar8 = ppFVar8 + 1) {
      this_00 = *ppFVar8;
      EVar4 = FileDescriptor::edition(this_00);
      if ((EVar4 == EDITION_PROTO3) && (0 < this_00->message_type_count_)) {
        bVar3 = anon_unknown_5::ContainsProto3Optional(this_00->message_types_);
        if (bVar3) {
LAB_001da408:
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(this_00->name_->_M_dataplus)._M_p,
                              this_00->name_->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,": is a proto3 file that contains optional fields, but code generator ",
                     0x45);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(codegen_name->_M_dataplus)._M_p,codegen_name->_M_string_length
                             );
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,
                     " hasn\'t been updated to support optional fields in proto3. Please ask the owner of this code generator to support proto3 optional."
                     ,0x82);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          return false;
        }
        lVar7 = 0;
        lVar6 = 0xa0;
        do {
          lVar7 = lVar7 + 1;
          iVar1 = this_00->message_type_count_;
          if (iVar1 <= lVar7) goto LAB_001da3f8;
          bVar3 = anon_unknown_5::ContainsProto3Optional
                            ((Descriptor *)(&this_00->message_types_->super_SymbolBase + lVar6));
          lVar6 = lVar6 + 0xa0;
        } while (!bVar3);
        if (lVar7 < iVar1) goto LAB_001da408;
      }
LAB_001da3f8:
    }
  }
  return true;
}

Assistant:

bool CommandLineInterface::EnforceProto3OptionalSupport(
    const std::string& codegen_name, uint64_t supported_features,
    const std::vector<const FileDescriptor*>& parsed_files) const {
  bool supports_proto3_optional =
      supported_features & CodeGenerator::FEATURE_PROTO3_OPTIONAL;
  if (!supports_proto3_optional) {
    for (const auto fd : parsed_files) {
      if (ContainsProto3Optional(
              ::google::protobuf::internal::InternalFeatureHelper::GetEdition(*fd), fd)) {
        std::cerr << fd->name()
                  << ": is a proto3 file that contains optional fields, but "
                     "code generator "
                  << codegen_name
                  << " hasn't been updated to support optional fields in "
                     "proto3. Please ask the owner of this code generator to "
                     "support proto3 optional."
                  << std::endl;
        return false;
      }
    }
  }
  return true;
}